

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolIPv4.cpp
# Opt level: O0

void __thiscall ProtocolIPv4::ProcessRx(ProtocolIPv4 *this,DataBuffer *buffer)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint16_t uVar4;
  byte *sourceIP_00;
  byte *pbVar5;
  uint16_t dataLength;
  uint16_t length;
  uint8_t *packet;
  uint8_t *targetIP;
  uint8_t *sourceIP;
  uint8_t protocol;
  uint8_t headerLength;
  DataBuffer *buffer_local;
  ProtocolIPv4 *this_local;
  
  pbVar5 = buffer->Packet;
  bVar2 = (*pbVar5 & 0xf) << 2;
  uVar4 = Unpack16(pbVar5,2);
  bVar1 = pbVar5[9];
  sourceIP_00 = pbVar5 + 0xc;
  pbVar5 = pbVar5 + 0x10;
  bVar3 = IsLocal(this,pbVar5);
  if (bVar3) {
    buffer->Packet = buffer->Packet + bVar2;
    buffer->Length = uVar4 - bVar2;
    switch(bVar1) {
    case 1:
      ProtocolICMP::ProcessRx(this->ICMP,buffer,sourceIP_00,pbVar5);
      break;
    case 2:
      break;
    default:
      printf("Unsupported IP Protocol 0x%02X\n",(ulong)bVar1);
      break;
    case 6:
      ProtocolTCP::ProcessRx(this->TCP,buffer,sourceIP_00,pbVar5);
      break;
    case 0x11:
      ProtocolUDP::ProcessRx(this->UDP,buffer,sourceIP_00,pbVar5);
    }
  }
  return;
}

Assistant:

void ProtocolIPv4::ProcessRx(DataBuffer* buffer)
{
    uint8_t headerLength;
    uint8_t protocol;
    uint8_t* sourceIP;
    uint8_t* targetIP;
    uint8_t* packet = buffer->Packet;
    uint16_t length = buffer->Length;
    uint16_t dataLength;

    headerLength = (packet[0] & 0x0F) * 4;
    dataLength = Unpack16(packet, 2);
    protocol = packet[9];
    sourceIP = &packet[12];
    targetIP = &packet[16];

    if (IsLocal(targetIP))
    {
        buffer->Packet += headerLength;
        dataLength -= headerLength;
        buffer->Length = dataLength;

        switch (protocol)
        {
        case 0x01: // ICMP
            ICMP.ProcessRx(buffer, sourceIP, targetIP);
            break;
        case 0x02: // IGMP
            break;
        case 0x06: // TCP
            TCP.ProcessRx(buffer, sourceIP, targetIP);
            break;
        case 0x11: // UDP
            UDP.ProcessRx(buffer, sourceIP, targetIP);
            break;
        default: printf("Unsupported IP Protocol 0x%02X\n", protocol); break;
        }
    }
}